

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Library>
          (Structure *this,Library *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  Library *dest_local;
  Structure *this_local;
  
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  ReadFieldArray<1,char,240ul>(this,&dest->name,"name",db);
  ReadFieldArray<2,char,240ul>(this,&dest->filename,"filename",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Library>(this,&dest->parent,"*parent",db,false);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<Library> (
    Library& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    ReadFieldArray<ErrorPolicy_Warn>(dest.name,"name",db);
    ReadFieldArray<ErrorPolicy_Fail>(dest.filename,"filename",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.parent,"*parent",db);

    db.reader->IncPtr(size);
}